

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfileCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout,RecyclableObject *function,uint flags,ProfileId profileId,
          InlineCacheIndex inlineCacheIndex,AuxArray<unsigned_int> *spreadIndices)

{
  ProfileId callApplyCallSiteNum;
  FunctionBody *this_00;
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  TypeId TVar4;
  BOOL BVar5;
  JavascriptFunction *this_01;
  DynamicProfileInfo *this_02;
  ProfileId *pPVar6;
  FunctionInfo *targetFunctionInfo;
  undefined4 *puVar7;
  Var object;
  JavascriptFunction *local_a8;
  FunctionInfo *local_80;
  JavascriptFunction *local_78;
  ProfileId callApplyCallSiteId;
  ProfileId *callSiteToCallApplyCallSiteMap;
  bool isConstructorCall;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionInfo *functionInfo;
  FunctionBody *functionBody;
  JavascriptFunction *targetFunction;
  InlineCacheIndex inlineCacheIndex_local;
  ProfileId profileId_local;
  uint flags_local;
  RecyclableObject *function_local;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  bVar2 = VarIs<Js::JavascriptFunction>((Var)**(undefined8 **)(this + 0x28));
  if (bVar2) {
    local_78 = UnsafeVarTo<Js::JavascriptFunction>((Var)**(undefined8 **)(this + 0x28));
  }
  else {
    local_78 = (JavascriptFunction *)0x0;
  }
  this_00 = *(FunctionBody **)(this + 0x88);
  TVar4 = RecyclableObject::GetTypeId(function);
  if (TVar4 == TypeIds_Function) {
    this_01 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    local_80 = JavascriptFunction::GetFunctionInfo(this_01);
  }
  else {
    local_80 = (FunctionInfo *)0x0;
  }
  this_02 = FunctionBody::GetDynamicProfileInfo(this_00);
  OP_CallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
            (this,playout,function,flags,spreadIndices);
  local_a8 = (JavascriptFunction *)function;
  if (local_80 == (FunctionInfo *)0x0) {
    local_a8 = (JavascriptFunction *)0x0;
  }
  DynamicProfileInfo::RecordCallSiteInfo
            (this_02,this_00,profileId,local_80,local_a8,
             (uint)(playout->
                   super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                   super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                   super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.ArgCount,
             (flags & 1) == 1,inlineCacheIndex);
  if ((((local_80 != (FunctionInfo *)0x0) && (BVar5 = FunctionInfo::HasBody(local_80), BVar5 == 0))
      && ((bVar2 = FunctionInfo::IsBuiltInApplyFunction(local_80), bVar2 ||
          (bVar2 = FunctionInfo::IsBuiltInCallFunction(local_80), bVar2)))) &&
     ((local_78 != (JavascriptFunction *)0x0 &&
      (pPVar6 = FunctionBody::GetCallSiteToCallApplyCallSiteArray(*(FunctionBody **)(this + 0x88)),
      pPVar6 != (ProfileId *)0x0)))) {
    callApplyCallSiteNum = pPVar6[profileId];
    PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(this_00);
    if (callApplyCallSiteNum < PVar3) {
      targetFunctionInfo = JavascriptFunction::GetFunctionInfo(local_78);
      DynamicProfileInfo::RecordCallApplyTargetInfo
                (this_02,this_00,callApplyCallSiteNum,targetFunctionInfo,local_78);
    }
    else if (callApplyCallSiteNum != 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xfc5,"(callApplyCallSiteId == Js::Constants::NoProfileId)",
                                  "callApplyCallSiteId == Js::Constants::NoProfileId");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  if ((playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
      super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return != -1) {
    object = GetReg<unsigned_int>
                       (this,(int)(playout->
                                  super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                  ).
                                  super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                  .super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                                  Return);
    DynamicProfileInfo::RecordReturnTypeOnCallSiteInfo(this_02,this_00,profileId,object);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfileCallCommon(const unaligned T * playout, RecyclableObject * function, unsigned flags, ProfileId profileId, InlineCacheIndex inlineCacheIndex, const Js::AuxArray<uint32> *spreadIndices)
    {
        JavascriptFunction * targetFunction = VarIs<JavascriptFunction>(m_outParams[0]) ? UnsafeVarTo<JavascriptFunction>(m_outParams[0]) : nullptr;
        FunctionBody* functionBody = this->m_functionBody;
        FunctionInfo* functionInfo = function->GetTypeId() == TypeIds_Function ?
            VarTo<JavascriptFunction>(function)->GetFunctionInfo() : nullptr;
        DynamicProfileInfo* dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        bool isConstructorCall = (CallFlags_New & flags) == CallFlags_New;


        OP_CallCommon<T>(playout, function, flags, spreadIndices);


        // Profile call site

        dynamicProfileInfo->RecordCallSiteInfo(functionBody, profileId, functionInfo, functionInfo ? static_cast<JavascriptFunction*>(function) : nullptr, playout->ArgCount, isConstructorCall, inlineCacheIndex);

        if (functionInfo && !functionInfo->HasBody())
        {
            if ((functionInfo->IsBuiltInApplyFunction() || functionInfo->IsBuiltInCallFunction()) && targetFunction)
            {
                Js::ProfileId* callSiteToCallApplyCallSiteMap = this->m_functionBody->GetCallSiteToCallApplyCallSiteArray();
                if (callSiteToCallApplyCallSiteMap)
                {
                    Js::ProfileId callApplyCallSiteId = callSiteToCallApplyCallSiteMap[profileId];
                    if (callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())
                    {
                        dynamicProfileInfo->RecordCallApplyTargetInfo(functionBody, callApplyCallSiteId, targetFunction->GetFunctionInfo(), targetFunction);
                    }
                    else
                    {
                        Assert(callApplyCallSiteId == Js::Constants::NoProfileId);
                    }
                }
            }
        }

        if (playout->Return != Js::Constants::NoRegister)
        {
            dynamicProfileInfo->RecordReturnTypeOnCallSiteInfo(functionBody, profileId, GetReg((RegSlot)playout->Return));
        }
    }